

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O2

_Bool vma_has_flag(unsigned_long vm_start,char *flag)

{
  byte bVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint uVar6;
  bool bVar7;
  byte local_448 [8];
  char buf [1024];
  unsigned_long end;
  unsigned_long local_38;
  unsigned_long start;
  
  local_38 = 0;
  buf[0x3f8] = '\0';
  buf[0x3f9] = '\0';
  buf[0x3fa] = '\0';
  buf[0x3fb] = '\0';
  buf[0x3fc] = '\0';
  buf[0x3fd] = '\0';
  buf[0x3fe] = '\0';
  buf[0x3ff] = '\0';
  __stream = fopen("/proc/self/smaps","r");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","f != NULL","false",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",
            0x2f,"vma_has_flag");
    exit(-1);
  }
LAB_00101979:
  do {
    pcVar3 = fgets((char *)local_448,0x400,__stream);
    if (pcVar3 == (char *)0x0) {
      bVar7 = false;
      goto LAB_00101a75;
    }
    pbVar4 = local_448;
    for (pbVar5 = local_448; pbVar4 = pbVar4 + 1, bVar1 = *pbVar5, bVar1 != 0; pbVar5 = pbVar5 + 1)
    {
      if (9 < (byte)(bVar1 - 0x30)) {
        uVar6 = bVar1 - 0x2d;
        if (0x39 < uVar6) break;
        if ((0x3f0000003f00000U >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
          if ((ulong)uVar6 == 0) goto LAB_001019c9;
          break;
        }
      }
    }
LAB_00101a1a:
    iVar2 = bcmp(local_448,"VmFlags: ",9);
  } while ((iVar2 != 0) || (local_38 != vm_start));
  pbVar4 = local_448;
  while( true ) {
    pcVar3 = strtok((char *)pbVar4," \n");
    bVar7 = pcVar3 != (char *)0x0;
    if ((pcVar3 == (char *)0x0) || (((*pcVar3 == 'd' && (pcVar3[1] == 'd')) && (pcVar3[2] == '\0')))
       ) break;
    pbVar4 = (byte *)0x0;
  }
LAB_00101a75:
  fclose(__stream);
  return bVar7;
LAB_001019c9:
  bVar1 = *pbVar4;
  if (bVar1 == 0) goto LAB_00101a1a;
  if ((9 < (byte)(bVar1 - 0x30)) &&
     ((0x25 < bVar1 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) == 0)))) {
    if (bVar1 == 0x20) {
      __isoc99_sscanf(local_448,"%lx-%lx",&local_38,buf + 0x3f8);
      goto LAB_00101979;
    }
    goto LAB_00101a1a;
  }
  pbVar4 = pbVar4 + 1;
  goto LAB_001019c9;
}

Assistant:

static bool
vma_has_flag(unsigned long vm_start, const char *flag)
{
	unsigned long start = 0, end = 0;
	char buf[1024], *tok = NULL;
	bool found = false;
	FILE *f = NULL;

	f = fopen("/proc/self/smaps", "r");
	fail_unless(f != NULL);

	while (fgets(buf, sizeof(buf), f)) {
		if (is_vma_range_fmt(buf, &start, &end))
			continue;
		if (strncmp(buf, "VmFlags: ", 9) || start != vm_start)
			continue;
		tok = buf;
		break;
	}

	if (tok) {
		for (tok = strtok(tok, " \n"); tok;
		     tok = strtok(NULL, " \n")) {
			if (strcmp(tok, flag))
				continue;
			found = true;
			break;
		}
	}

	fclose(f);
	return found;
}